

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ReplicatedAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_2,
          SourceRange *args_3)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elements;
  ReplicatedAssignmentPatternExpression *pRVar1;
  ReplicatedAssignmentPatternExpression *in_RCX;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  Type *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pRVar1 = (ReplicatedAssignmentPatternExpression *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  elements._M_extent._M_extent_value = in_RSI._M_extent_value;
  elements._M_ptr = in_RDX;
  ast::ReplicatedAssignmentPatternExpression::ReplicatedAssignmentPatternExpression
            (in_RCX,in_R8,
             (Expression *)(in_RCX->super_AssignmentPatternExpressionBase).super_Expression.type.ptr
             ,elements,in_stack_00000000);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }